

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O1

APInt __thiscall llvm::APInt::getSplat(APInt *this,uint NewLen,APInt *V)

{
  uint ShiftAmt;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  ulong __n;
  APInt AVar2;
  APInt R;
  anon_union_8_2_1313ab2f_for_U local_38;
  uint local_30;
  undefined8 uVar1;
  
  if (V->BitWidth <= NewLen) {
    AVar2 = zextOrSelf(this,(uint)V);
    uVar1 = AVar2._8_8_;
    for (ShiftAmt = V->BitWidth; ShiftAmt < NewLen; ShiftAmt = ShiftAmt * 2) {
      local_30 = this->BitWidth;
      if ((ulong)local_30 < 0x41) {
        local_38 = (anon_union_8_2_1313ab2f_for_U)(this->U).pVal;
      }
      else {
        __n = (ulong)((uint)((ulong)local_30 + 0x3f >> 3) & 0xfffffff8);
        local_38.pVal = (uint64_t *)operator_new__(__n);
        memcpy(local_38.pVal,(this->U).pVal,__n);
      }
      operator<<=((APInt *)&local_38,ShiftAmt);
      operator|=(this,(APInt *)&local_38);
      uVar1 = extraout_RDX;
      if ((0x40 < local_30) && ((uint64_t *)local_38.VAL != (uint64_t *)0x0)) {
        operator_delete__(local_38.pVal);
        uVar1 = extraout_RDX_00;
      }
    }
    AVar2._8_8_ = uVar1;
    AVar2.U.pVal = (uint64_t *)this;
    return AVar2;
  }
  __assert_fail("NewLen >= V.getBitWidth() && \"Can\'t splat to smaller bit width!\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                ,0x20a,"static APInt llvm::APInt::getSplat(unsigned int, const APInt &)");
}

Assistant:

APInt APInt::getSplat(unsigned NewLen, const APInt &V) {
  assert(NewLen >= V.getBitWidth() && "Can't splat to smaller bit width!");

  APInt Val = V.zextOrSelf(NewLen);
  for (unsigned I = V.getBitWidth(); I < NewLen; I <<= 1)
    Val |= Val << I;

  return Val;
}